

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O3

errr finish_parse_profile(parser *p)

{
  undefined8 *puVar1;
  room_profile *prVar2;
  char *pcVar3;
  room_builder_conflict p_Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  angband_constants *paVar9;
  wchar_t wVar10;
  long *plVar11;
  undefined8 *p_00;
  room_profile *prVar12;
  cave_profile *pcVar13;
  long lVar14;
  wchar_t *pwVar15;
  ushort uVar16;
  undefined8 *puVar17;
  cave_profile *pcVar18;
  size_t sVar19;
  undefined8 *p_01;
  ulong uVar20;
  byte bVar21;
  
  bVar21 = 0;
  plVar11 = (long *)parser_priv(p);
  paVar9 = z_info;
  z_info->profile_max = 0;
  if (plVar11 == (long *)0x0) {
    sVar19 = 0;
  }
  else {
    uVar16 = 0;
    do {
      uVar16 = uVar16 + 1;
      plVar11 = (long *)*plVar11;
    } while (plVar11 != (long *)0x0);
    paVar9->profile_max = uVar16;
    sVar19 = (ulong)uVar16 << 7;
  }
  cave_profiles = (cave_profile *)mem_zalloc(sVar19);
  uVar16 = z_info->profile_max;
  p_00 = (undefined8 *)parser_priv(p);
  uVar8 = (ulong)uVar16;
  pcVar13 = cave_profiles;
  while (cave_profiles = pcVar13, p_00 != (undefined8 *)0x0) {
    uVar20 = uVar8 - 1;
    puVar17 = p_00;
    pcVar18 = pcVar13 + uVar20;
    for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
      pcVar18->next = (cave_profile *)*puVar17;
      puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
      pcVar18 = (cave_profile *)((long)pcVar18 + (ulong)bVar21 * -0x10 + 8);
    }
    puVar17 = (undefined8 *)*p_00;
    pcVar18 = pcVar13 + uVar8;
    if ((long)(ulong)z_info->profile_max <= (long)uVar8) {
      pcVar18 = (cave_profile *)0x0;
    }
    pwVar15 = &pcVar13[uVar20].n_room_profiles;
    pcVar13[uVar20].next = pcVar18;
    plVar11 = (long *)p_00[0xe];
    if (plVar11 == (long *)0x0) {
      *pwVar15 = L'\0';
      prVar12 = (room_profile *)0x0;
    }
    else {
      sVar19 = 0;
      wVar10 = L'\0';
      do {
        wVar10 = wVar10 + L'\x01';
        plVar11 = (long *)*plVar11;
        sVar19 = sVar19 + 0x38;
      } while (plVar11 != (long *)0x0);
      *pwVar15 = wVar10;
      prVar12 = (room_profile *)mem_zalloc(sVar19);
      pcVar13 = cave_profiles;
      if (L'\0' < cave_profiles[uVar20].n_room_profiles) {
        lVar14 = 0;
        p_01 = (undefined8 *)p_00[0xe];
        prVar2 = prVar12;
        do {
          pcVar3 = (char *)p_01[1];
          p_Var4 = (room_builder_conflict)p_01[2];
          uVar5 = p_01[3];
          uVar6 = p_01[4];
          uVar7 = p_01[5];
          prVar2->next = (room_profile *)*p_01;
          prVar2->name = pcVar3;
          *(undefined8 *)&prVar2->cutoff = p_01[6];
          prVar2->width = (int)uVar6;
          prVar2->level = (int)((ulong)uVar6 >> 0x20);
          prVar2->pit = (_Bool)(char)uVar7;
          *(int3 *)&prVar2->field_0x29 = (int3)((ulong)uVar7 >> 8);
          prVar2->rarity = (int)((ulong)uVar7 >> 0x20);
          prVar2->builder = p_Var4;
          prVar2->rating = (int)uVar5;
          prVar2->height = (int)((ulong)uVar5 >> 0x20);
          if (prVar2->next != (room_profile *)0x0) {
            prVar2->next = prVar2 + 1;
          }
          puVar1 = (undefined8 *)*p_01;
          mem_free(p_01);
          lVar14 = lVar14 + 1;
          pcVar13 = cave_profiles;
          p_01 = puVar1;
          prVar2 = prVar2 + 1;
        } while (lVar14 < cave_profiles[uVar20].n_room_profiles);
      }
    }
    pcVar13[uVar20].room_profiles = prVar12;
    mem_free(p_00);
    p_00 = puVar17;
    uVar8 = uVar20;
    pcVar13 = cave_profiles;
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_profile(struct parser *p) {
	struct cave_profile *n, *c = parser_priv(p);
	int num;

	/* Count the list */
	z_info->profile_max = 0;
	while (c) {
		z_info->profile_max++;
		c = c->next;
	}

	/* Allocate the array and copy the records to it */
	cave_profiles = mem_zalloc(z_info->profile_max * sizeof(*c));
	num = z_info->profile_max - 1;
	for (c = parser_priv(p); c; c = n) {
		/* Main record */
		memcpy(&cave_profiles[num], c, sizeof(*c));
		n = c->next;
		if (num < z_info->profile_max - 1) {
			cave_profiles[num].next = &cave_profiles[num + 1];
		} else {
			cave_profiles[num].next = NULL;
		}

		if (c->room_profiles) {
			struct room_profile *r_old = c->room_profiles;
			struct room_profile *r_new;
			int i;

			/* Count the room profiles */
			cave_profiles[num].n_room_profiles = 0;
			while (r_old) {
				++cave_profiles[num].n_room_profiles;
				r_old = r_old->next;
			}

			/* Now allocate the room profile array */
			r_new = mem_zalloc(cave_profiles[num].n_room_profiles
				* sizeof(*r_new));

			r_old = c->room_profiles;
			for (i = 0; i < cave_profiles[num].n_room_profiles; i++) {
				struct room_profile *r_temp = r_old;

				/* Copy from the linked list to the array */
				memcpy(&r_new[i], r_old, sizeof(*r_old));

				/* Set the next profile pointer correctly. */
				if (r_new[i].next) {
					r_new[i].next = &r_new[i + 1];
				}

				/* Tidy up and advance to the next profile. */
				r_old = r_old->next;
				mem_free(r_temp);
			}

			cave_profiles[num].room_profiles = r_new;
		} else {
			cave_profiles[num].n_room_profiles = 0;
			cave_profiles[num].room_profiles = NULL;
		}

		mem_free(c);
		num--;
	}

	parser_destroy(p);
	return 0;
}